

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  byte *pbVar1;
  byte bVar2;
  uchar uVar3;
  Mem *pVal;
  double dVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  sqlite3_int64 sVar9;
  sqlite3_int64 sVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int *z;
  ulong uVar14;
  uchar *zDate;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int local_cc;
  double local_c8;
  int M;
  undefined4 uStack_bc;
  sqlite3_context *local_b8;
  sqlite3_value **local_b0;
  int Y;
  undefined4 uStack_a4;
  char local_a0;
  int local_9f [5];
  double local_88;
  undefined8 uStack_80;
  long local_70;
  DateTime local_68;
  
  p->s = 0.0;
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validJD = '\0';
  p->validTZ = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar5 = setDateTimeToCurrent(context,p);
    return iVar5;
  }
  pVal = *argv;
  local_b8 = context;
  local_b0 = argv;
  if (pVal->type - 1 < 2) {
    dVar4 = sqlite3VdbeRealValue(pVal);
    uVar16 = SUB84(dVar4,0);
    uVar17 = (undefined4)((ulong)dVar4 >> 0x20);
  }
  else {
    puVar8 = sqlite3_value_text(pVal);
    if (puVar8 == (uchar *)0x0) {
      return 1;
    }
    uVar3 = *puVar8;
    uVar14 = (ulong)(uVar3 == '-');
    iVar5 = getDigits((char *)(puVar8 + uVar14),4,0,9999,0x2d,&Y,2,1,0xc,0x2d,&M,2,1,0x1f,0,
                      &local_cc);
    if (iVar5 == 3) {
      zDate = puVar8 + uVar14 + 9;
      do {
        do {
          pbVar1 = zDate + 1;
          zDate = zDate + 1;
        } while ((ulong)*pbVar1 == 0x54);
      } while ((""[*pbVar1] & 1) != 0);
      iVar5 = parseHhMmSs((char *)zDate,p);
      argv = local_b0;
      if (iVar5 != 0) {
        if (*zDate != '\0') goto LAB_00183e91;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar5 = -Y;
      if (uVar3 != '-') {
        iVar5 = Y;
      }
      p->Y = iVar5;
      p->M = M;
      p->D = local_cc;
      if (p->validTZ != '\0') {
        computeJD(p);
        argv = local_b0;
      }
      goto LAB_00183681;
    }
LAB_00183e91:
    iVar5 = parseHhMmSs((char *)puVar8,p);
    if (iVar5 == 0) goto LAB_00183681;
    iVar5 = sqlite3_stricmp((char *)puVar8,"now");
    if (iVar5 == 0) {
      iVar5 = setDateTimeToCurrent(local_b8,p);
      if (iVar5 != 0) {
        return 1;
      }
      goto LAB_00183681;
    }
    iVar5 = sqlite3Strlen30((char *)puVar8);
    iVar5 = sqlite3AtoF((char *)puVar8,(double *)&local_68,iVar5,'\x01');
    if (iVar5 == 0) {
      return 1;
    }
    uVar16 = (undefined4)local_68.iJD;
    uVar17 = (undefined4)((ulong)local_68.iJD >> 0x20);
  }
  p->iJD = (long)((double)CONCAT44(uVar17,uVar16) * 86400000.0 + 0.5);
  p->validJD = '\x01';
LAB_00183681:
  local_70 = (long)argc;
  lVar15 = 1;
  do {
    if (local_70 <= lVar15) {
      return 0;
    }
    puVar8 = sqlite3_value_text(argv[lVar15]);
    if (puVar8 == (uchar *)0x0) {
      return 1;
    }
    local_cc = 1;
    for (lVar11 = 0; (lVar11 != 0x1d && ((ulong)puVar8[lVar11] != 0)); lVar11 = lVar11 + 1) {
      *(uchar *)((long)&Y + lVar11) = ""[puVar8[lVar11]];
    }
    *(undefined1 *)((long)&Y + lVar11) = 0;
    uVar14 = (ulong)(byte)Y;
    if (((Y & 0xffU) - 0x30 < 10) || ((Y & 0xffU) == 0x2b)) {
LAB_00183705:
      z = &Y;
      lVar11 = 1;
      while( true ) {
        bVar2 = *(byte *)((long)&Y + lVar11);
        if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) break;
        lVar11 = lVar11 + 1;
        z = (int *)((long)z + 1);
      }
      iVar5 = sqlite3AtoF((char *)&Y,(double *)&M,(int)lVar11,'\x01');
      if (iVar5 == 0) {
        return 1;
      }
      if (bVar2 == 0x3a) {
        local_68.s = 0.0;
        local_68.validYMD = '\0';
        local_68.validHMS = '\0';
        local_68.validJD = '\0';
        local_68.validTZ = '\0';
        local_68._44_4_ = 0;
        local_68.D = 0;
        local_68.h = 0;
        local_68.m = 0;
        local_68.tz = 0;
        local_68.iJD = 0;
        local_68.Y = 0;
        local_68.M = 0;
        iVar5 = parseHhMmSs((char *)((long)&Y + (ulong)(uVar14 - 0x3a < 0xfffffffffffffff6)),
                            &local_68);
        if (iVar5 == 0) {
          computeJD(&local_68);
          lVar12 = (local_68.iJD + -43200000) % 86400000;
          lVar11 = -lVar12;
          if ((byte)Y != '-') {
            lVar11 = lVar12;
          }
          computeJD(p);
          p->validYMD = '\0';
          p->validHMS = '\0';
          p->validTZ = '\0';
          p->iJD = p->iJD + lVar11;
          local_cc = 0;
        }
      }
      else {
        do {
          pbVar1 = (byte *)((long)z + 1);
          z = (int *)((long)z + 1);
        } while ((""[*pbVar1] & 1) != 0);
        uVar6 = sqlite3Strlen30((char *)z);
        if (uVar6 - 0xb < 0xfffffff8) goto LAB_00183d88;
        uVar7 = uVar6 - 1;
        if (*(char *)((long)z + (ulong)uVar7) == 's') {
          *(undefined1 *)((long)z + (ulong)uVar7) = 0;
          uVar6 = uVar7;
        }
        computeJD(p);
        local_cc = 0;
        local_88 = (double)CONCAT44(uStack_bc,M);
        if (uVar6 - 3 < 4) {
          uStack_80 = 0;
          local_c8 = *(double *)(&DAT_0018a8b0 + (ulong)(local_88 < 0.0) * 8);
          switch(uVar6) {
          case 3:
            iVar5 = strcmp((char *)z,"day");
            if (iVar5 != 0) goto LAB_00183c0b;
            local_88 = local_88 * 86400000.0;
            break;
          case 4:
            iVar5 = strcmp((char *)z,"hour");
            if (iVar5 != 0) {
              iVar5 = strcmp((char *)z,"year");
              if (iVar5 != 0) goto LAB_00183c0b;
              iVar5 = (int)local_88;
              computeYMD_HMS(p);
              p->Y = p->Y + iVar5;
              p->validJD = '\0';
              computeJD(p);
              dVar4 = (double)(int)local_88;
              if ((local_88 != dVar4) || (NAN(local_88) || NAN(dVar4))) {
                dVar4 = (local_88 - dVar4) * 365.0;
                goto LAB_00183d66;
              }
              goto LAB_00183d7d;
            }
            local_88 = local_88 * 3600000.0;
            break;
          case 5:
            iVar5 = strcmp((char *)z,"month");
            if (iVar5 != 0) goto LAB_00183c0b;
            computeYMD_HMS(p);
            iVar13 = (int)local_88;
            iVar5 = p->M + iVar13;
            if (iVar5 == 0 || SCARRY4(p->M,iVar13) != iVar5 < 0) {
              uVar6 = -((0xcU - iVar5) / 0xc);
            }
            else {
              uVar6 = (iVar5 - 1U) / 0xc;
            }
            p->Y = p->Y + uVar6;
            p->M = uVar6 * -0xc + iVar5;
            p->validJD = '\0';
            computeJD(p);
            dVar4 = (double)iVar13;
            if ((local_88 == dVar4) && (!NAN(local_88) && !NAN(dVar4))) goto LAB_00183d7d;
            dVar4 = (local_88 - dVar4) * 30.0;
LAB_00183d66:
            local_88 = dVar4 * 86400000.0 + local_c8;
            goto LAB_00183d79;
          case 6:
            iVar5 = strcmp((char *)z,"minute");
            if (iVar5 == 0) {
              local_88 = local_88 * 60000.0;
            }
            else {
              iVar5 = strcmp((char *)z,"second");
              if (iVar5 != 0) goto LAB_00183c0b;
              local_88 = local_88 * 1000.0;
            }
          }
          local_88 = local_88 + local_c8;
LAB_00183d79:
          p->iJD = p->iJD + (long)local_88;
        }
        else {
LAB_00183c0b:
          local_cc = 1;
        }
LAB_00183d7d:
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->validTZ = '\0';
      }
LAB_00183d88:
      if (local_cc != 0) {
        return 1;
      }
    }
    else {
      if ((Y & 0xffU) == 0x77) {
        if (CONCAT44(uStack_a4,Y) == 0x207961646b656577) {
          iVar5 = sqlite3Strlen30(&local_a0);
          iVar5 = sqlite3AtoF(&local_a0,(double *)&M,iVar5,'\x01');
          if (((iVar5 != 0) && (dVar4 = (double)CONCAT44(uStack_bc,M), dVar4 < 7.0)) &&
             (uVar6 = (uint)dVar4, -1 < (int)uVar6)) {
            if ((dVar4 == (double)(int)dVar4) && (!NAN(dVar4) && !NAN((double)(int)dVar4))) {
              computeYMD_HMS(p);
              p->validJD = '\0';
              p->validTZ = '\0';
              computeJD(p);
              lVar11 = ((p->iJD + 0x7b98a00) / 86400000) % 7;
              if ((long)(ulong)uVar6 < lVar11) {
                lVar11 = lVar11 + -7;
              }
              p->iJD = ((ulong)uVar6 - lVar11) * 86400000 + p->iJD;
              p->validYMD = '\0';
              p->validHMS = '\0';
              p->validTZ = '\0';
              goto LAB_00183d98;
            }
          }
        }
        goto LAB_00183d88;
      }
      uVar6 = Y & 0xff;
      if (uVar6 == 0x6c) {
        iVar5 = bcmp(&Y,"localtime",10);
        if (iVar5 == 0) {
          computeJD(p);
          sVar9 = localtimeOffset(p,local_b8,&local_cc);
          p->iJD = p->iJD + sVar9;
          p->validYMD = '\0';
          p->validHMS = '\0';
          p->validTZ = '\0';
        }
        goto LAB_00183d88;
      }
      if (uVar6 != 0x73) {
        if (uVar6 == 0x75) {
          iVar5 = bcmp(&Y,"unixepoch",10);
          if ((iVar5 == 0) && (p->validJD != '\0')) {
            p->iJD = (p->iJD + 0xa8c0) / 0x15180 + 0xbfc83e532200;
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->validTZ = '\0';
            goto LAB_00183d98;
          }
          if (Y == 0x637475) {
            computeJD(p);
            sVar9 = localtimeOffset(p,local_b8,&local_cc);
            if (local_cc != 0) {
              return 1;
            }
            p->iJD = p->iJD - sVar9;
            p->validYMD = '\0';
            p->validHMS = '\0';
            p->validTZ = '\0';
            sVar10 = localtimeOffset(p,local_b8,&local_cc);
            p->iJD = p->iJD + (sVar9 - sVar10);
          }
        }
        else if (uVar6 == 0x2d) goto LAB_00183705;
        goto LAB_00183d88;
      }
      iVar5 = bcmp(&Y,"start of ",9);
      if (iVar5 != 0) goto LAB_00183d88;
      computeYMD(p);
      p->validHMS = '\x01';
      p->validJD = '\0';
      p->h = 0;
      p->m = 0;
      p->s = 0.0;
      p->validTZ = '\0';
      iVar5 = bcmp(local_9f,"month",6);
      if (iVar5 == 0) {
        p->D = 1;
      }
      else {
        iVar5 = bcmp(local_9f,"year",5);
        if (iVar5 == 0) {
          computeYMD(p);
          p->M = 1;
          p->D = 1;
        }
        else if (local_9f[0] != 0x796164) goto LAB_00183d88;
      }
    }
LAB_00183d98:
    lVar15 = lVar15 + 1;
    argv = local_b0;
  } while( true );
}

Assistant:

static int isDate(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv, 
  DateTime *p
){
  int i;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    p->iJD = (sqlite3_int64)(sqlite3_value_double(argv[0])*86400000.0 + 0.5);
    p->validJD = 1;
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, p) ) return 1;
  }
  return 0;
}